

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O0

void ev3dev::sound::speak(string *text,bool bSynchronous)

{
  ostream *poVar1;
  char *__command;
  byte in_SIL;
  string *in_RDI;
  ostringstream cmd;
  string local_1b8 [48];
  ostringstream local_188 [383];
  byte local_9;
  string *local_8;
  
  local_9 = in_SIL & 1;
  local_8 = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar1 = std::operator<<((ostream *)local_188,"/usr/bin/espeak -a 200 --stdout \"");
  poVar1 = std::operator<<(poVar1,local_8);
  poVar1 = std::operator<<(poVar1,"\"");
  std::operator<<(poVar1," | /usr/bin/aplay -q");
  if ((local_9 & 1) == 0) {
    std::operator<<((ostream *)local_188," &");
  }
  std::__cxx11::ostringstream::str();
  __command = (char *)std::__cxx11::string::c_str();
  system(__command);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return;
}

Assistant:

void sound::speak(const std::string &text, bool bSynchronous) {
    std::ostringstream cmd;

    cmd << "/usr/bin/espeak -a 200 --stdout \"" << text << "\""
        << " | /usr/bin/aplay -q";

    if (!bSynchronous) cmd << " &";

    std::system(cmd.str().c_str());
}